

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-mock-test.cc
# Opt level: O0

void __thiscall
FileTest_FdopenNoRetry_Test::FileTest_FdopenNoRetry_Test(FileTest_FdopenNoRetry_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__FileTest_FdopenNoRetry_Test_001da438;
  return;
}

Assistant:

TEST(FileTest, FdopenNoRetry) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  fdopen_count = 1;
  EXPECT_SYSTEM_ERROR(read_end.fdopen("r"),
      EINTR, "cannot associate stream with file descriptor");
  fdopen_count = 0;
}